

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLut.cpp
# Opt level: O0

void anon_unknown.dwarf_142438::testHalfLut(void)

{
  bool bVar1;
  half *phVar2;
  float fVar3;
  int x_3;
  int y_3;
  Box2i dw;
  Slice s;
  int x_2;
  int y_2;
  int x_1;
  int y_1;
  int x;
  int y;
  HalfLut lut;
  Array2D<Imath_3_2::half> h;
  int NY;
  int NX;
  float in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffeec;
  Array2D<Imath_3_2::half> *in_stack_fffffffffffffef0;
  _func_half_half *in_stack_ffffffffffffff08;
  HalfLut *in_stack_ffffffffffffff10;
  Vec2<int> local_b8;
  int local_b0;
  int local_ac;
  Vec2<int> local_a8;
  Vec2<int> local_a0;
  Box<Imath_3_2::Vec2<int>_> local_98;
  Slice local_88 [60];
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  half local_28 [4];
  Array2D<Imath_3_2::half> local_20;
  undefined4 local_8;
  undefined4 local_4;
  
  local_4 = 0x43;
  local_8 = 0x1f;
  Imf_3_2::Array2D<Imath_3_2::half>::Array2D
            (in_stack_fffffffffffffef0,CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
             ,CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  Imf_3_2::HalfLut::HalfLut<Imath_3_2::half(*)(Imath_3_2::half)>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  for (local_38 = 0; local_38 < 0x1f; local_38 = local_38 + 1) {
    for (local_3c = 0; local_3c < 0x43; local_3c = local_3c + 1) {
      Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_20,(long)local_38);
      Imath_3_2::half::operator=
                ((half *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 in_stack_fffffffffffffedc);
    }
  }
  phVar2 = Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_20,0);
  Imf_3_2::HalfLut::apply(local_28,(int)phVar2,0x81d);
  local_40 = 0;
  do {
    if (0x1e < local_40) {
      for (local_48 = 0; local_48 < 0x1f; local_48 = local_48 + 1) {
        for (local_4c = 0; local_4c < 0x43; local_4c = local_4c + 1) {
          Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_20,(long)local_48);
          Imath_3_2::half::operator=
                    ((half *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                     in_stack_fffffffffffffedc);
        }
      }
      phVar2 = Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_20,0);
      uVar5 = 0;
      uVar4 = 0;
      Imf_3_2::Slice::Slice(local_88,HALF,(char *)phVar2,2,0x86,1,1,0.0,false,false);
      Imath_3_2::Vec2<int>::Vec2(&local_a0,3,5);
      Imath_3_2::Vec2<int>::Vec2(&local_a8,0x2d,0x1b);
      Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
                ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffffef0,
                 (Vec2<int> *)CONCAT44(in_stack_fffffffffffffeec,uVar5),
                 (Vec2<int> *)CONCAT44(in_stack_fffffffffffffee4,uVar4));
      Imf_3_2::HalfLut::apply((Slice *)local_28,(Box *)local_88);
      local_ac = 0;
      do {
        if (0x1e < local_ac) {
          Imf_3_2::HalfLut::~HalfLut((HalfLut *)0x1d1904);
          Imf_3_2::Array2D<Imath_3_2::half>::~Array2D
                    ((Array2D<Imath_3_2::half> *)CONCAT44(in_stack_fffffffffffffee4,uVar4));
          return;
        }
        for (local_b0 = 0; local_b0 < 0x43; local_b0 = local_b0 + 1) {
          Imath_3_2::Vec2<int>::Vec2(&local_b8,local_b0,local_ac);
          bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::intersects(&local_98,&local_b8);
          if (bVar1) {
            Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_20,(long)local_ac);
            fVar3 = Imath_3_2::half::operator_cast_to_float
                              ((half *)CONCAT44(in_stack_fffffffffffffee4,uVar4));
            if ((fVar3 != 1.0) || (NAN(fVar3))) {
              __assert_fail("h[y][x] == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                            ,0x4c,"void (anonymous namespace)::testHalfLut()");
            }
          }
          else {
            Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_20,(long)local_ac);
            fVar3 = Imath_3_2::half::operator_cast_to_float
                              ((half *)CONCAT44(in_stack_fffffffffffffee4,uVar4));
            if ((fVar3 != 0.0) || (NAN(fVar3))) {
              __assert_fail("h[y][x] == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                            ,0x4e,"void (anonymous namespace)::testHalfLut()");
            }
          }
        }
        local_ac = local_ac + 1;
      } while( true );
    }
    for (local_44 = 0; local_44 < 0x43; local_44 = local_44 + 1) {
      Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_20,(long)local_40);
      fVar3 = Imath_3_2::half::operator_cast_to_float
                        ((half *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      if ((fVar3 != 1.0) || (NAN(fVar3))) {
        __assert_fail("h[y][x] == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                      ,0x33,"void (anonymous namespace)::testHalfLut()");
      }
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

void
testHalfLut ()
{
    const int NX = 67;
    const int NY = 31;

    Array2D<half> h (NY, NX);
    HalfLut       lut (one);

    //
    // apply (data, nData, stride);
    //

    for (int y = 0; y < NY; ++y)
        for (int x = 0; x < NX; ++x)
            h[y][x] = 0;

    lut.apply (&h[0][0], NX * NY, 1);

    for (int y = 0; y < NY; ++y)
        for (int x = 0; x < NX; ++x)
            assert (h[y][x] == 1);

    //
    // apply (slice, dataWindow);
    //

    for (int y = 0; y < NY; ++y)
        for (int x = 0; x < NX; ++x)
            h[y][x] = 0;

    Slice s (
        HALF,                  // type
        (char*) &h[0][0],      // base
        sizeof (h[0][0]),      // xStride
        sizeof (h[0][0]) * NX, // yStride
        1,
        1); // xSampling, ySampling

    Box2i dw (V2i (3, 5), V2i (45, 27));

    lut.apply (s, dw);

    for (int y = 0; y < NY; ++y)
        for (int x = 0; x < NX; ++x)
            if (dw.intersects (V2i (x, y)))
                assert (h[y][x] == 1);
            else
                assert (h[y][x] == 0);
}